

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::SelfTest
          (CCoinsViewCacheTest *this,bool sanity_check)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  byte in_SIL;
  long in_FS_OFFSET;
  pair<const_COutPoint,_CCoinsCacheEntry> *entry;
  CCoinsMap *__range2;
  iterator __end2;
  iterator __begin2;
  size_t count;
  size_t ret;
  CCoinsViewCache *in_stack_fffffffffffffe68;
  lazy_ostream *in_stack_fffffffffffffe70;
  CCoinsViewCache *in_stack_fffffffffffffe78;
  const_string *in_stack_fffffffffffffe90;
  const_string *msg;
  size_t in_stack_fffffffffffffe98;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffea0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffea8;
  char *this_00;
  undefined4 in_stack_fffffffffffffeb8;
  size_t local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [32];
  const_string local_a0;
  undefined1 local_90 [20];
  uint local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [64];
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> local_28;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> local_20;
  undefined1 local_18 [8];
  lazy_ostream local_10;
  
  local_10._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_10._vptr_lazy_ostream =
       (_func_int **)
       memusage::
       DynamicUsage<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,144ul,8ul>
                 ((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                   *)in_stack_fffffffffffffea0);
  local_18 = (undefined1  [8])0x0;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
       ::begin((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                *)in_stack_fffffffffffffe70);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
       ::end((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
              *)in_stack_fffffffffffffe70);
  while (bVar1 = std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                             *)in_stack_fffffffffffffe78,
                            (_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                             *)in_stack_fffffffffffffe70), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator*((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
              in_stack_fffffffffffffe68);
    sVar3 = Coin::DynamicMemoryUsage((Coin *)in_stack_fffffffffffffe68);
    local_10._vptr_lazy_ostream = (_func_int **)(sVar3 + (long)local_10._vptr_lazy_ostream);
    local_18 = (undefined1  [8])((long)local_18 + 1);
    std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *)
               in_stack_fffffffffffffe68);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe70,(char (*) [1])in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
    uVar2 = CCoinsViewCache::GetCacheSize(in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe78 = (CCoinsViewCache *)0x1e818c5;
    in_stack_fffffffffffffe70 = (lazy_ostream *)local_18;
    in_stack_fffffffffffffe68 = (CCoinsViewCache *)0x1cd69b4;
    local_7c = uVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_long>
              (local_68,local_78,0x5f,1,2,&local_7c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    line_num = local_90;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
    file = &local_a0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe70,(char (*) [1])in_stack_fffffffffffffe68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
               (pointer)in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
    local_d8 = CCoinsViewCache::DynamicMemoryUsage(in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe78 = (CCoinsViewCache *)0x1c9c677;
    in_stack_fffffffffffffe70 = &local_10;
    in_stack_fffffffffffffe68 = (CCoinsViewCache *)0x1cd7640;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_c0,local_d0,0x60,1,2,&local_d8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if ((in_SIL & 1) != 0) {
    CCoinsViewCache::SanityCheck((CCoinsViewCache *)CONCAT44(uVar2,in_stack_fffffffffffffeb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10._8_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SelfTest(bool sanity_check = true) const
    {
        // Manually recompute the dynamic usage of the whole data, and compare it.
        size_t ret = memusage::DynamicUsage(cacheCoins);
        size_t count = 0;
        for (const auto& entry : cacheCoins) {
            ret += entry.second.coin.DynamicMemoryUsage();
            ++count;
        }
        BOOST_CHECK_EQUAL(GetCacheSize(), count);
        BOOST_CHECK_EQUAL(DynamicMemoryUsage(), ret);
        if (sanity_check) {
            SanityCheck();
        }
    }